

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O3

void * custommalloc(size_t __size)

{
  size_t *psVar1;
  bool bVar2;
  TheCustomHeapType *pTVar3;
  pthread_t pVar4;
  void *ptr;
  char *pcVar5;
  TheCustomHeapType *pTVar6;
  TheCustomHeapType *pTVar7;
  void *extraout_RAX;
  size_t sVar8;
  ulong uVar9;
  HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
  *pHVar10;
  char *pcVar11;
  Entry *pEVar12;
  HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
  *this;
  ulong uVar13;
  
  bVar2 = isCustomHeapInitialized();
  if (!bVar2) {
    pcVar11 = initBufferPtr + __size;
    if (&xxmalloc::initialized < pcVar11) {
      initBufferPtr = pcVar11;
      abort();
    }
    if (xxmalloc::initialized != '\0') {
      pcVar5 = initBufferPtr;
      initBufferPtr = pcVar11;
      return pcVar5;
    }
    pcVar5 = initBufferPtr;
    initBufferPtr = pcVar11;
    xxmalloc::initialized = 1;
    return pcVar5;
  }
  pTVar3 = getCustomHeap();
  if (__size < 0x401) {
    sVar8 = 0x10;
    if (0x10 < __size) {
      sVar8 = __size;
    }
    uVar9 = sVar8 * 2 - 1;
    uVar13 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar9 = (uVar13 ^ 0xffffffffffffffc0) + 0x3c;
    pEVar12 = (pTVar3->
              super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
              )._localHeap._item[uVar9 & 0xffffffff].head.next;
    if (pEVar12 != (Entry *)0x0) {
      pTVar3[2].
      super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
      ._pad[(uVar13 ^ 0xffffffffffffffc0) + 0xc] = (double)pEVar12->next;
      psVar1 = &(pTVar3->
                super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                )._localHeapBytes;
      *psVar1 = *psVar1 + (-0x10L << ((byte)uVar9 & 0x3f));
      return pEVar12;
    }
    this = (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
            *)(pTVar3->
              super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
              )._parentHeap;
  }
  else {
    this = (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
            *)(pTVar3->
              super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
              )._parentHeap;
    if (0x8000 < __size) {
      ptr = HL::
            HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
            ::slowPath(this,__size);
      goto LAB_00109afa;
    }
  }
  pVar4 = pthread_self();
  ptr = Hoard::LockMallocHeap<Hoard::SmallHeap>::malloc
                  ((LockMallocHeap<Hoard::SmallHeap> *)
                   ((this->super_ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>)._heap._item +
                   *(int *)((long)(this->super_ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>)
                                  ._tidMap._item + (ulong)((uint)(pVar4 >> 10) & 0x1ffc))),__size);
LAB_00109afa:
  Hoard::
  RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
  ::getSize((RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
             *)this,ptr);
  if (ptr != (void *)0x0) {
    return ptr;
  }
  custommalloc_cold_1();
  pTVar6 = getCustomHeap();
  pTVar3 = pTVar6;
  if (((this != (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
                 *)0x0) && (uVar9 = (ulong)this & 0xfffffffffffc0000, uVar9 != 0)) &&
     (pTVar3 = (TheCustomHeapType *)(*(ulong *)(uVar9 + 8) ^ uVar9),
     pTVar3 == (TheCustomHeapType *)0xcafed00d)) {
    uVar13 = *(ulong *)(uVar9 + 0x10);
    pTVar7 = (TheCustomHeapType *)((long)this - *(long *)(uVar9 + 0x48));
    if (*(char *)(uVar9 + 0x18) == '\x01') {
      pHVar10 = (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
                 *)(uVar13 - 1 & (ulong)pTVar7);
      pTVar3 = pTVar7;
    }
    else {
      pTVar3 = (TheCustomHeapType *)((ulong)pTVar7 / uVar13);
      pHVar10 = (HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
                 *)((ulong)pTVar7 % uVar13);
    }
    pEVar12 = (Entry *)((long)this - (long)pHVar10);
    if ((uVar13 < 0x401) &&
       (pTVar3 = (TheCustomHeapType *)
                 (pTVar6->
                 super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                 )._localHeapBytes,
       (long)(pTVar3->
             super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
             )._pad + uVar13 < 0x1000001)) {
      if (uVar13 < 0x11) {
        uVar13 = 0x10;
      }
      uVar9 = uVar13 * 2 - 1;
      uVar13 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar9 = (uVar13 ^ 0xffffffffffffffc0) + 0x3c;
      uVar13 = uVar9 & 0xffffffff;
      pEVar12->next =
           (pTVar6->
           super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
           )._localHeap._item[uVar13].head.next;
      (pTVar6->
      super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
      )._localHeap._item[uVar13].head.next = pEVar12;
      pTVar3 = (TheCustomHeapType *)
               ((long)(pTVar3->
                      super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                      )._pad + (0x10L << ((byte)uVar9 & 0x3f)));
      (pTVar6->
      super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
      )._localHeapBytes = (size_t)pTVar3;
    }
    else if ((pHVar10 != this) &&
            ((pTVar3 = (TheCustomHeapType *)((ulong)pEVar12 & 0xfffffffffffc0000),
             pTVar3 != (TheCustomHeapType *)0x0 &&
             (pTVar3 = (TheCustomHeapType *)
                       ((ulong)pTVar3 ^
                       (ulong)(pTVar3->
                              super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                              )._pad[1]), pTVar3 == (TheCustomHeapType *)0xcafed00d)))) {
      HL::
      HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
      ::free((HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
              *)(pTVar6->
                super_ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>
                )._parentHeap,pEVar12);
      return extraout_RAX;
    }
  }
  return pTVar3;
}

Assistant:

FLATTEN void * MYCDECL CUSTOM_MALLOC(size_t sz)
{
  void * ptr = xxmalloc(sz);
  return ptr;
}